

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void __thiscall
RPCHelpMan::RPCHelpMan
          (RPCHelpMan *this,string name,string description,
          vector<RPCArg,_std::allocator<RPCArg>_> args,RPCResults results,RPCExamples examples,
          RPCMethodImpl fun)

{
  Type TVar1;
  long lVar2;
  pointer pRVar3;
  pointer pRVar4;
  string_view func;
  pointer pbVar5;
  pointer pRVar6;
  byte *pbVar7;
  uint *puVar8;
  variant_alternative_t<2UL,_variant<Optional,_basic_string<char,_char_traits<char>,_allocator<char>_>,_UniValue>_>
  *pvVar9;
  NonFatalCheckError *this_00;
  undefined8 *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_R8;
  char *pcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string *name_1;
  pointer __k;
  key_type *__k_00;
  pointer pRVar11;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view msg;
  string_view file;
  bool local_99;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inner_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  param_names;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar10 = (char *)in_R8;
  std::__cxx11::string::string((string *)this,in_RSI);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::function
            (&this->m_fun,
             (function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             name._M_dataplus._M_p);
  std::__cxx11::string::string((string *)&this->m_description,in_RDX);
  pRVar6 = (pointer)in_RCX[1];
  (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)*in_RCX;
  (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar6;
  (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_RCX[2];
  *in_RCX = 0;
  in_RCX[1] = 0;
  in_RCX[2] = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&(this->m_results).m_results,in_R8);
  std::__cxx11::string::string((string *)&this->m_examples,in_R9);
  this->m_req = (JSONRPCRequest *)0x0;
  param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &param_names._M_t._M_impl.super__Rb_tree_header._M_header;
  param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pRVar3 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
           super__Vector_impl_data._M_finish;
  param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pRVar6 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar6 != pRVar3; pRVar6 = pRVar6 + 1) {
    str._M_str = (char *)0x7c;
    str._M_len = (size_t)(pRVar6->m_names)._M_dataplus._M_p;
    util::SplitString_abi_cxx11_
              (&names,(util *)(pRVar6->m_names)._M_string_length,str,(char)pcVar10);
    pbVar5 = names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__k = names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __k != pbVar5; __k = __k + 1) {
      pbVar7 = (byte *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[](&param_names,__k);
      inner_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = ~*pbVar7 & 1;
      inline_check_non_fatal<bool>
                ((bool *)&inner_names,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                 ,0x23d,"RPCHelpMan","!(param_type & POSITIONAL)");
      inner_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = (*pbVar7 & 4) == 0;
      pcVar10 = "!(param_type & NAMED_ONLY)";
      inline_check_non_fatal<bool>
                ((bool *)&inner_names,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                 ,0x23e,"RPCHelpMan","!(param_type & NAMED_ONLY)");
      *pbVar7 = *pbVar7 | 1;
    }
    if (pRVar6->m_type == OBJ_NAMED_PARAMS) {
      pRVar4 = (pRVar6->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pRVar11 = (pRVar6->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                     super__Vector_impl_data._M_start; pRVar11 != pRVar4; pRVar11 = pRVar11 + 1) {
        str_00._M_str = (char *)0x7c;
        str_00._M_len = (size_t)(pRVar11->m_names)._M_dataplus._M_p;
        util::SplitString_abi_cxx11_
                  (&inner_names,(util *)(pRVar11->m_names)._M_string_length,str_00,(char)pcVar10);
        pbVar5 = inner_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__k_00 = (key_type *)
                      CONCAT71(inner_names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               (byte)inner_names.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start); __k_00 != pbVar5;
            __k_00 = __k_00 + 1) {
          puVar8 = (uint *)std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::operator[](&param_names,__k_00);
          local_99 = (pRVar11->m_opts).also_positional;
          if ((*puVar8 & 1) == 0) {
            local_99 = true;
          }
          inline_check_non_fatal<bool>
                    (&local_99,
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                     ,0x246,"RPCHelpMan",
                     "!(param_type & POSITIONAL) || inner.m_opts.also_positional");
          local_99 = (*puVar8 & 2) == 0;
          inline_check_non_fatal<bool>
                    (&local_99,
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                     ,0x247,"RPCHelpMan","!(param_type & NAMED)");
          local_99 = (*puVar8 & 4) == 0;
          pcVar10 = "!(param_type & NAMED_ONLY)";
          inline_check_non_fatal<bool>
                    (&local_99,
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                     ,0x248,"RPCHelpMan","!(param_type & NAMED_ONLY)");
          *puVar8 = *puVar8 | ((pRVar11->m_opts).also_positional ^ 1) * 2 + 2;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&inner_names);
      }
    }
    if (*(__index_type *)
         ((long)&(pRVar6->m_fallback).
                 super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                 .
                 super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
         + 0x58) == '\x02') {
      TVar1 = pRVar6->m_type;
      pvVar9 = std::get<2ul,RPCArg::Optional,std::__cxx11::string,UniValue>(&pRVar6->m_fallback);
      switch(pvVar9->typ) {
      case VNULL:
        break;
      case VOBJ:
        inner_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = TVar1 == OBJ;
        pcVar10 = "type == RPCArg::Type::OBJ";
        inline_check_non_fatal<bool>
                  ((bool *)&inner_names,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                   ,0x252,"RPCHelpMan","type == RPCArg::Type::OBJ");
        break;
      case VARR:
        inner_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = TVar1 == ARR;
        pcVar10 = "type == RPCArg::Type::ARR";
        inline_check_non_fatal<bool>
                  ((bool *)&inner_names,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                   ,0x255,"RPCHelpMan","type == RPCArg::Type::ARR");
        break;
      case VSTR:
        inner_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = true;
        if ((TVar1 != STR) && (TVar1 != STR_HEX)) {
          inner_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_1_ = TVar1 == AMOUNT;
        }
        pcVar10 = 
        "type == RPCArg::Type::STR || type == RPCArg::Type::STR_HEX || type == RPCArg::Type::AMOUNT"
        ;
        inline_check_non_fatal<bool>
                  ((bool *)&inner_names,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                   ,600,"RPCHelpMan",
                   "type == RPCArg::Type::STR || type == RPCArg::Type::STR_HEX || type == RPCArg::Type::AMOUNT"
                  );
        break;
      case VNUM:
        inner_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = TVar1 == RANGE || (TVar1 & ~BOOL) == NUM;
        pcVar10 = 
        "type == RPCArg::Type::NUM || type == RPCArg::Type::AMOUNT || type == RPCArg::Type::RANGE";
        inline_check_non_fatal<bool>
                  ((bool *)&inner_names,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                   ,0x25b,"RPCHelpMan",
                   "type == RPCArg::Type::NUM || type == RPCArg::Type::AMOUNT || type == RPCArg::Type::RANGE"
                  );
        break;
      case VBOOL:
        inner_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = TVar1 == BOOL;
        pcVar10 = "type == RPCArg::Type::BOOL";
        inline_check_non_fatal<bool>
                  ((bool *)&inner_names,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                   ,0x25e,"RPCHelpMan","type == RPCArg::Type::BOOL");
        break;
      default:
        this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
        func._M_str = "RPCHelpMan";
        func._M_len = 10;
        msg._M_str = "Unreachable code reached (non-fatal)";
        msg._M_len = 0x24;
        file._M_str = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp";
        file._M_len = 0x55;
        NonFatalCheckError::NonFatalCheckError(this_00,msg,file,0x264,func);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          __cxa_throw(this_00,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_002fc64a;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&names);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&param_names._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_002fc64a:
  __stack_chk_fail();
}

Assistant:

RPCHelpMan::RPCHelpMan(std::string name, std::string description, std::vector<RPCArg> args, RPCResults results, RPCExamples examples, RPCMethodImpl fun)
    : m_name{std::move(name)},
      m_fun{std::move(fun)},
      m_description{std::move(description)},
      m_args{std::move(args)},
      m_results{std::move(results)},
      m_examples{std::move(examples)}
{
    // Map of parameter names and types just used to check whether the names are
    // unique. Parameter names always need to be unique, with the exception that
    // there can be pairs of POSITIONAL and NAMED parameters with the same name.
    enum ParamType { POSITIONAL = 1, NAMED = 2, NAMED_ONLY = 4 };
    std::map<std::string, int> param_names;

    for (const auto& arg : m_args) {
        std::vector<std::string> names = SplitString(arg.m_names, '|');
        // Should have unique named arguments
        for (const std::string& name : names) {
            auto& param_type = param_names[name];
            CHECK_NONFATAL(!(param_type & POSITIONAL));
            CHECK_NONFATAL(!(param_type & NAMED_ONLY));
            param_type |= POSITIONAL;
        }
        if (arg.m_type == RPCArg::Type::OBJ_NAMED_PARAMS) {
            for (const auto& inner : arg.m_inner) {
                std::vector<std::string> inner_names = SplitString(inner.m_names, '|');
                for (const std::string& inner_name : inner_names) {
                    auto& param_type = param_names[inner_name];
                    CHECK_NONFATAL(!(param_type & POSITIONAL) || inner.m_opts.also_positional);
                    CHECK_NONFATAL(!(param_type & NAMED));
                    CHECK_NONFATAL(!(param_type & NAMED_ONLY));
                    param_type |= inner.m_opts.also_positional ? NAMED : NAMED_ONLY;
                }
            }
        }
        // Default value type should match argument type only when defined
        if (arg.m_fallback.index() == 2) {
            const RPCArg::Type type = arg.m_type;
            switch (std::get<RPCArg::Default>(arg.m_fallback).getType()) {
            case UniValue::VOBJ:
                CHECK_NONFATAL(type == RPCArg::Type::OBJ);
                break;
            case UniValue::VARR:
                CHECK_NONFATAL(type == RPCArg::Type::ARR);
                break;
            case UniValue::VSTR:
                CHECK_NONFATAL(type == RPCArg::Type::STR || type == RPCArg::Type::STR_HEX || type == RPCArg::Type::AMOUNT);
                break;
            case UniValue::VNUM:
                CHECK_NONFATAL(type == RPCArg::Type::NUM || type == RPCArg::Type::AMOUNT || type == RPCArg::Type::RANGE);
                break;
            case UniValue::VBOOL:
                CHECK_NONFATAL(type == RPCArg::Type::BOOL);
                break;
            case UniValue::VNULL:
                // Null values are accepted in all arguments
                break;
            default:
                NONFATAL_UNREACHABLE();
                break;
            }
        }
    }
}